

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O0

iterator __thiscall spvtools::opt::InstructionList::iterator::Erase(iterator *this)

{
  iterator_template<spvtools::opt::Instruction> *in_RSI;
  iterator_template<spvtools::opt::Instruction> local_20;
  iterator_template<spvtools::opt::Instruction> next_node;
  iterator *this_local;
  
  utils::IntrusiveList<spvtools::opt::Instruction>::iterator_template<spvtools::opt::Instruction>::
  iterator_template(&local_20,in_RSI);
  utils::IntrusiveList<spvtools::opt::Instruction>::iterator_template<spvtools::opt::Instruction>::
  operator++(&local_20);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
            (&in_RSI->node_->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  if (in_RSI->node_ != (Instruction *)0x0) {
    (*(in_RSI->node_->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase
      [1])();
  }
  iterator(this,&local_20);
  return (iterator)(iterator)this;
}

Assistant:

iterator Erase() {
      iterator_template next_node = *this;
      ++next_node;
      node_->RemoveFromList();
      delete node_;
      return next_node;
    }